

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::
int_writer<unsigned_long,_fmt::v5::basic_format_specs<wchar_t>_>::on_num
          (int_writer<unsigned_long,_fmt::v5::basic_format_specs<wchar_t>_> *this)

{
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_> *this_00;
  num_writer f;
  int iVar1;
  wchar_t wVar2;
  string_view prefix;
  int size;
  char_type sep;
  int num_digits;
  int_writer<unsigned_long,_fmt::v5::basic_format_specs<wchar_t>_> *this_local;
  
  iVar1 = internal::count_digits(this->abs_value);
  wVar2 = internal::thousands_sep<wchar_t>((locale_ref)(this->writer->locale_).locale_);
  iVar1 = iVar1 + (iVar1 + -1) / 3;
  this_00 = this->writer;
  prefix = get_prefix(this);
  f.sep = wVar2;
  f.size = iVar1;
  f.abs_value = this->abs_value;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
  write_int<fmt::v5::basic_format_specs<wchar_t>,fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<wchar_t>>::num_writer>
            ((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>> *)
             this_00,iVar1,prefix,this->spec,f);
  return;
}

Assistant:

void on_num() {
      int num_digits = internal::count_digits(abs_value);
      char_type sep = internal::thousands_sep<char_type>(writer.locale_);
      int size = num_digits + SEP_SIZE * ((num_digits - 1) / 3);
      writer.write_int(size, get_prefix(), spec,
                       num_writer{abs_value, size, sep});
    }